

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_count_quantity.cpp
# Opt level: O0

void __thiscall
polyscope::SurfaceVertexIsolatedScalarQuantity::buildVertexInfoGUI
          (SurfaceVertexIsolatedScalarQuantity *this,size_t vInd)

{
  bool bVar1;
  iterator text;
  mapped_type_conflict1 *pmVar2;
  map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
  *in_RDI;
  _Self in_stack_ffffffffffffffe0;
  _Self local_18 [3];
  
  std::__cxx11::string::c_str();
  ImGui::TextUnformatted((char *)in_stack_ffffffffffffffe0._M_node,(char *)in_RDI);
  ImGui::NextColumn();
  local_18[0]._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
       ::find(in_RDI,(key_type_conflict *)0x3c89a6);
  text = std::
         map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
         ::end(in_RDI);
  bVar1 = std::operator==(local_18,(_Self *)&stack0xffffffffffffffe0);
  if (bVar1) {
    ImGui::TextUnformatted((char *)text._M_node,(char *)in_RDI);
  }
  else {
    pmVar2 = std::
             map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
             ::operator[]((map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
                           *)this,(key_type_conflict *)vInd);
    ImGui::Text((char *)*pmVar2,"%g");
  }
  ImGui::NextColumn();
  return;
}

Assistant:

void SurfaceVertexIsolatedScalarQuantity::buildVertexInfoGUI(size_t vInd) {
  ImGui::TextUnformatted(name.c_str());
  ImGui::NextColumn();
  if (values.find(vInd) == values.end()) {
    ImGui::TextUnformatted("-");
  } else {
    ImGui::Text("%g", values[vInd]);
  }
  ImGui::NextColumn();
}